

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

NaVector * __thiscall NaVector::shift(NaVector *this,int iOffset)

{
  NaReal *pNVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  iVar2 = (*this->_vptr_NaVector[6])();
  if ((iVar2 <= iOffset) || (iVar2 = (*this->_vptr_NaVector[6])(this), iOffset <= -iVar2)) {
    (*this->_vptr_NaVector[0xd])(this);
    return this;
  }
  if (0 < iOffset) {
    uVar3 = (*this->_vptr_NaVector[6])(this);
    pNVar1 = this->pVect;
    while( true ) {
      uVar3 = uVar3 - 1;
      if ((int)(uVar3 - iOffset) < 0) break;
      pNVar1[uVar3] = pNVar1[uVar3 - iOffset];
    }
    pNVar1 = this->pVect;
    for (uVar4 = 0; (uint)iOffset != uVar4; uVar4 = uVar4 + 1) {
      pNVar1[uVar4] = 0.0;
    }
    return this;
  }
  if (-1 < iOffset) {
    return this;
  }
  for (lVar5 = 0; iVar2 = (*this->_vptr_NaVector[6])(this), lVar5 < iVar2 + iOffset;
      lVar5 = lVar5 + 1) {
    this->pVect[lVar5] = this->pVect[lVar5 - iOffset];
  }
  iVar2 = (*this->_vptr_NaVector[6])(this);
  for (lVar5 = (long)(iVar2 + iOffset); iVar2 = (*this->_vptr_NaVector[6])(this), lVar5 < iVar2;
      lVar5 = lVar5 + 1) {
    this->pVect[lVar5] = 0.0;
  }
  return this;
}

Assistant:

NaVector&
NaVector::shift (int iOffset)
{
    int i;

    if(iOffset >= (int)dim() ||
       iOffset <= - (int)dim()){
       init_zero();
    }else if(iOffset > 0){
        for(i = dim() - iOffset - 1; i >= 0; --i){
            pVect[i + iOffset] = pVect[i];
        }
        for(i = 0; i < iOffset; ++i){
            pVect[i] = 0.0;
        }
    }else if(iOffset < 0){
        for(i = 0; i < (int)dim() + iOffset; ++i){
            pVect[i] = pVect[i - iOffset];
        }
        for(i = dim() + iOffset; i < (int)dim(); ++i){
            pVect[i] = 0.0;
        }
    }
    // else
    //   iOffset == 0
    
    return *this;
}